

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonAppendRaw(JsonString *p,char *zIn,u32 N)

{
  uint in_EDX;
  JsonString *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_EDX != 0) {
    if ((ulong)in_EDX + *(long *)(in_RDI + 0x18) < *(ulong *)(in_RDI + 0x10)) {
      memcpy((void *)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x18)),in_RSI,(ulong)in_EDX);
      *(ulong *)(in_RDI + 0x18) = (ulong)in_EDX + *(long *)(in_RDI + 0x18);
    }
    else {
      jsonStringExpandAndAppend(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    }
  }
  return;
}

Assistant:

static void jsonAppendRaw(JsonString *p, const char *zIn, u32 N){
  if( N==0 ) return;
  if( N+p->nUsed >= p->nAlloc ){
    jsonStringExpandAndAppend(p,zIn,N);
  }else{
    memcpy(p->zBuf+p->nUsed, zIn, N);
    p->nUsed += N;
  }
}